

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-maxpooling2d.cc
# Opt level: O2

Dim * __thiscall
dynet::MaxPooling2D::dim_forward
          (Dim *__return_storage_ptr__,MaxPooling2D *this,
          vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs)

{
  bool bVar1;
  uint b;
  pointer pDVar2;
  uint *puVar3;
  pointer puVar4;
  pointer puVar5;
  Dim *pDVar6;
  ostream *poVar7;
  invalid_argument *piVar8;
  uint i;
  long lVar9;
  float fVar10;
  allocator_type local_1d0 [32];
  Dim *local_1b0;
  vector<long,_std::allocator<long>_> output_shape;
  
  pDVar2 = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar2 != 0x24) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&output_shape);
    poVar7 = std::operator<<((ostream *)&output_shape,"MaxPooling2D requires exactly one input: ");
    operator<<(poVar7,xs);
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar8,(string *)local_1d0);
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (pDVar2->nd == 3) {
    if ((this->is_valid == true) &&
       ((puVar3 = (this->ksize).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start, pDVar2->d[0] < *puVar3 ||
        (pDVar2->d[1] < puVar3[1])))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&output_shape);
      poVar7 = std::operator<<((ostream *)&output_shape,
                               "Bad input dimensions in MaxPooling2D:         in VALID mode, the kernel size cannot be greater than the feature map size"
                              );
      operator<<(poVar7,xs);
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(piVar8,(string *)local_1d0);
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    b = pDVar2->bd;
    local_1b0 = __return_storage_ptr__;
    std::vector<long,_std::allocator<long>_>::vector(&output_shape,3,local_1d0);
    pDVar2 = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    output_shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = (ulong)pDVar2->d[2];
    puVar4 = (this->ksize).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->stride).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar1 = this->is_valid;
    for (lVar9 = 0; pDVar6 = local_1b0, lVar9 != 2; lVar9 = lVar9 + 1) {
      fVar10 = (float)pDVar2->d[lVar9];
      if (bVar1 != false) {
        fVar10 = (fVar10 - (float)puVar4[lVar9]) + 1.0;
      }
      fVar10 = ceilf(fVar10 / (float)puVar5[lVar9]);
      output_shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] = (long)fVar10;
    }
    Dim::Dim(local_1b0,&output_shape,b);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&output_shape.super__Vector_base<long,_std::allocator<long>_>);
    return pDVar6;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&output_shape);
  poVar7 = std::operator<<((ostream *)&output_shape,"Bad input dimensions in MaxPooling2D: ");
  operator<<(poVar7,xs);
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar8,(string *)local_1d0);
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim MaxPooling2D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1) {
    ostringstream s; s << "MaxPooling2D requires exactly one input: " << xs;
    throw std::invalid_argument(s.str());
  }
  if (xs[0].ndims() != 3) {
    ostringstream s; s << "Bad input dimensions in MaxPooling2D: " << xs;
    throw std::invalid_argument(s.str());
  }
  if (is_valid && (xs[0].d[0] < ksize[0] || xs[0].d[1] < ksize[1])) {
    ostringstream s; s << "Bad input dimensions in MaxPooling2D: \
        in VALID mode, the kernel size cannot be greater than the feature map size" << xs;
    throw std::invalid_argument(s.str());
  }
  unsigned bs = xs[0].batch_elems();
  std::vector<long> output_shape(3);
  output_shape[2] = static_cast<long>(xs[0].d[2]);
  for (unsigned i = 0; i < 2; ++i) {
    float input_dim = static_cast<float>(xs[0].d[i]);
    float kernel_dim = static_cast<float>(ksize[i]);
    float s = static_cast<float>(stride[i]);
    if (is_valid) {
      output_shape[i] = static_cast<long>(ceil((input_dim - kernel_dim + 1) / s));
    } else {
      output_shape[i] = static_cast<long>(ceil(input_dim / s));
    }
  }
  return Dim(output_shape, bs);
}